

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

color_quad_u8 __thiscall
crnd::dxt1_block::unpack_color(dxt1_block *this,uint16 packed_color,bool scaled,uint32 alpha)

{
  uint blue;
  uint green;
  undefined7 in_register_00000011;
  uint uVar1;
  uint red;
  undefined6 in_register_00000032;
  
  uVar1 = (uint)CONCAT62(in_register_00000032,packed_color);
  blue = uVar1 & 0x1f;
  green = (uint)(CONCAT62(in_register_00000032,packed_color) >> 5) & 0x3f;
  red = uVar1 >> 0xb;
  if ((int)CONCAT71(in_register_00000011,scaled) != 0) {
    blue = (blue >> 2) + blue * 8;
    green = (green >> 4) + green * 4;
    red = (uVar1 >> 0xd) + red * 8;
  }
  color_quad<unsigned_char,_int>::set((color_quad<unsigned_char,_int> *)this,red,green,blue,alpha);
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt1_block::unpack_color(uint16 packed_color, bool scaled, uint32 alpha)
    {
        uint32 b = packed_color & 31U;
        uint32 g = (packed_color >> 5U) & 63U;
        uint32 r = (packed_color >> 11U) & 31U;

        if (scaled)
        {
            b = (b << 3U) | (b >> 2U);
            g = (g << 2U) | (g >> 4U);
            r = (r << 3U) | (r >> 2U);
        }

        return color_quad_u8(r, g, b, alpha);
    }